

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

FieldBase * __thiscall FIX::FieldMap::getField(FieldMap *this,FieldBase *field)

{
  FieldBase *rhs;
  
  rhs = getFieldRef(this,field->m_tag);
  FieldBase::operator=(field,rhs);
  return field;
}

Assistant:

FieldBase& getField( FieldBase& field )
  const EXCEPT ( FieldNotFound )
  {
    field = getFieldRef( field.getTag() );
    return field;
  }